

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_streambuf.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  byte bVar2;
  __type _Var3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  streamoff sVar10;
  void *this;
  exception *e;
  string tmp;
  iostream io;
  streambuf buf_7;
  seekable sd;
  ostream out_4;
  istream in_5;
  streambuf is_1;
  streambuf os_1;
  input id_8;
  output od_1;
  string dummy_1;
  ostream out_3;
  istream in_4;
  streambuf is;
  streambuf os;
  input id_7;
  output od;
  string dummy;
  ostream out_2;
  streambuf buf_6;
  output id_6;
  string test_6;
  string test_msg;
  ostream out_1;
  streambuf buf_5;
  output id_5;
  string test_5;
  ostream out;
  streambuf buf_4;
  output id_4;
  string test_4;
  string s_3;
  istream in_3;
  streambuf buf_3;
  input id_3;
  string test_3;
  string s_2;
  istream in_2;
  streambuf buf_2;
  input id_2;
  string test_2;
  string s_1;
  istream in_1;
  streambuf buf_1;
  input id_1;
  string test_1;
  string s;
  istream in;
  streambuf buf;
  input id;
  string test;
  string *in_stack_ffffffffffffdbc8;
  seekable *in_stack_ffffffffffffdbd0;
  string *in_stack_ffffffffffffdbd8;
  output *in_stack_ffffffffffffdbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdbe8;
  undefined7 in_stack_ffffffffffffdbf0;
  undefined1 in_stack_ffffffffffffdbf7;
  undefined8 local_1820;
  undefined8 local_1818;
  fpos local_1810 [16];
  fpos local_1800 [16];
  fpos local_17f0 [16];
  fpos local_17e0 [16];
  string local_17d0 [32];
  undefined8 local_17b0;
  undefined8 local_17a8;
  fpos local_17a0 [16];
  undefined8 local_1790;
  undefined8 local_1788;
  fpos local_1780 [16];
  fpos local_1770 [16];
  fpos local_1760 [16];
  fpos local_1750 [16];
  long local_1740 [2];
  ostream local_1730 [272];
  io_device local_1620 [23];
  fpos local_1568 [16];
  fpos local_1558 [16];
  long local_1548 [34];
  long local_1438 [35];
  io_device local_1320 [18];
  io_device local_1290 [24];
  allocator local_11c9;
  string local_11c8 [32];
  undefined8 local_11a8;
  undefined8 local_11a0;
  undefined8 local_1198;
  undefined8 local_1190;
  long local_1188 [34];
  long local_1078 [35];
  io_device local_f60 [18];
  io_device local_ed0 [24];
  allocator local_e09;
  string local_e08 [32];
  ostream local_de8 [272];
  io_device local_cd8 [21];
  string local_c30 [39];
  allocator local_c09;
  string local_c08 [32];
  ostream local_be8 [272];
  io_device local_ad8 [21];
  string local_a30 [32];
  long local_a10 [34];
  io_device local_900 [21];
  string local_858 [32];
  string local_838 [32];
  undefined1 local_818 [280];
  io_device local_700 [21];
  allocator local_651;
  string local_650 [32];
  string local_630 [32];
  undefined1 local_610 [280];
  io_device local_4f8 [21];
  allocator local_449;
  string local_448 [32];
  string local_428 [32];
  istream local_408 [280];
  io_device local_2f0 [21];
  allocator local_241;
  string local_240 [32];
  string local_220 [32];
  istream local_200 [280];
  io_device local_e8 [21];
  allocator local_39;
  string local_38 [52];
  uint local_4;
  
  local_4 = 0;
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing input device");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Hello World\ndone",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  input::input((input *)in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
  booster::streambuf::streambuf((streambuf *)local_e8);
  booster::streambuf::device(local_e8);
  std::istream::istream(local_200,(streambuf *)local_e8);
  std::__cxx11::string::string(local_220);
  std::operator>>(local_200,local_220);
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," s==\"Hello\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x79);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::operator>>(local_200,local_220);
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," s==\"World\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7b);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::operator>>(local_200,local_220);
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," s==\"done\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7d);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  bVar2 = std::ios::eof();
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.eof()");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7e);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::__cxx11::string::~string(local_220);
  std::istream::~istream(local_200);
  booster::streambuf::~streambuf((streambuf *)local_e8);
  input::~input((input *)0x105a88);
  std::__cxx11::string::~string(local_38);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing input device, small buffer");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"Hello World\ndone",&local_241);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  input::input((input *)in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
  booster::streambuf::streambuf((streambuf *)local_2f0);
  booster::streambuf::set_buffer_size((ulong)local_2f0);
  booster::streambuf::device(local_2f0);
  std::istream::istream(local_408,(streambuf *)local_2f0);
  std::__cxx11::string::string(local_428);
  std::operator>>(local_408,local_428);
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," s==\"Hello\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8a);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::operator>>(local_408,local_428);
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," s==\"World\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8c);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::operator>>(local_408,local_428);
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," s==\"done\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8e);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  bVar2 = std::ios::eof();
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.eof()");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8f);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::__cxx11::string::~string(local_428);
  std::istream::~istream(local_408);
  booster::streambuf::~streambuf((streambuf *)local_2f0);
  input::~input((input *)0x106042);
  std::__cxx11::string::~string(local_240);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing input device, putback");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"Hello World\ndone",&local_449);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  input::input((input *)in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
  booster::streambuf::streambuf((streambuf *)local_4f8);
  booster::streambuf::set_buffer_size((ulong)local_4f8);
  booster::streambuf::device(local_4f8);
  std::istream::istream(local_610,(streambuf *)local_4f8);
  std::__cxx11::string::string(local_630);
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x48) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'H\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x9a);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x65) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'e\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x9b);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x6c) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x9c);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x6c) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x9d);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar6 = (long *)std::istream::putback((char)local_610);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.putback(\'l\')");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x9e);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar6 = (long *)std::istream::putback((char)local_610);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.putback(\'l\')");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x9f);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar6 = (long *)std::istream::putback((char)local_610);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.putback(\'e\')");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa0);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x65) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'e\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa1);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x6c) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa2);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x6c) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa3);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x6f) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'o\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa4);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar6 = (long *)std::istream::putback((char)local_610);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.putback(\'o\')");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa5);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x6f) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'o\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa6);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x20) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \' \'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa7);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar6 = (long *)std::istream::unget();
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.unget()");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa8);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x20) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \' \'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa9);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar6 = (long *)std::istream::putback((char)local_610);
  bVar2 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr," !in.putback(\'x\')");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xaa);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::__cxx11::string::~string(local_630);
  std::istream::~istream(local_610);
  booster::streambuf::~streambuf((streambuf *)local_4f8);
  input::~input((input *)0x107125);
  std::__cxx11::string::~string(local_448);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing input device, putback fail");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_650,"Hello World\ndone",&local_651);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  input::input((input *)in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
  booster::streambuf::streambuf((streambuf *)local_700);
  booster::streambuf::set_buffer_size((ulong)local_700);
  booster::streambuf::device(local_700);
  std::istream::istream(local_818,(streambuf *)local_700);
  std::__cxx11::string::string(local_838);
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x48) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'H\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb5);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x65) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'e\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb6);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x6c) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb7);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar4 = std::istream::get();
  if (iVar4 != 0x6c) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb8);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar6 = (long *)std::istream::unget();
  bVar2 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if ((bVar2 & 1) == 0) {
    plVar6 = (long *)std::istream::unget();
    bVar2 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
    if ((bVar2 & 1) == 0) {
      plVar6 = (long *)std::istream::unget();
      bVar2 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
      if ((bVar2 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr," !in.unget() || !in.unget() || !in.unget()")
        ;
        poVar5 = std::operator<<(poVar5," in ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb9);
        poVar5 = std::operator<<(poVar5," failed");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        errors = errors + 1;
      }
    }
  }
  std::__cxx11::string::~string(local_838);
  std::istream::~istream(local_818);
  booster::streambuf::~streambuf((streambuf *)local_700);
  input::~input((input *)0x1077ed);
  std::__cxx11::string::~string(local_650);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing output device");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_858);
  output::output(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8,
                 (size_t)in_stack_ffffffffffffdbd0);
  booster::streambuf::streambuf((streambuf *)local_900);
  booster::streambuf::device(local_900);
  std::ostream::ostream(local_a10,(streambuf *)local_900);
  std::operator<<((ostream *)local_a10,"test");
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," test==\"\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc3);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::ostream::operator<<(local_a10,std::flush<char,std::char_traits<char>>);
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," test==\"test\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc5);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_a10 + *(long *)(local_a10[0] + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," out");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc6);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  poVar5 = std::operator<<((ostream *)local_a10,"ab");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  tests = tests + 1;
  bVar2 = std::ios::operator!((ios *)((long)local_a10 + *(long *)(local_a10[0] + -0x18)));
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr," !out");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,200);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," test==\"testa\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc9);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::ostream::~ostream(local_a10);
  booster::streambuf::~streambuf((streambuf *)local_900);
  output::~output((output *)0x107e13);
  std::__cxx11::string::~string(local_858);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing output device, small buffer size");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_a30);
  output::output(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8,
                 (size_t)in_stack_ffffffffffffdbd0);
  booster::streambuf::streambuf((streambuf *)local_ad8);
  booster::streambuf::set_buffer_size((ulong)local_ad8);
  booster::streambuf::device(local_ad8);
  std::ostream::ostream(local_be8,(streambuf *)local_ad8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c08,"To be or not to be, that is the question!",&local_c09);
  std::allocator<char>::~allocator((allocator<char> *)&local_c09);
  std::operator<<(local_be8,local_c08);
  tests = tests + 1;
  lVar7 = std::__cxx11::string::size();
  uVar8 = std::__cxx11::string::size();
  if (uVar8 < lVar7 - 3U) {
    poVar5 = std::operator<<((ostream *)&std::cerr," test_msg.size() - 3 <= test.size()");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd5);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  uVar8 = std::__cxx11::string::size();
  uVar9 = std::__cxx11::string::size();
  if (uVar9 < uVar8) {
    poVar5 = std::operator<<((ostream *)&std::cerr," test.size() <= test_msg.size()");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd6);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::ostream::operator<<(local_be8,std::flush<char,std::char_traits<char>>);
  tests = tests + 1;
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffdbf7,in_stack_ffffffffffffdbf0),
                          in_stack_ffffffffffffdbe8);
  if (!_Var3) {
    poVar5 = std::operator<<((ostream *)&std::cerr," test==test_msg");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd8);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::__cxx11::string::~string(local_c08);
  std::ostream::~ostream(local_be8);
  booster::streambuf::~streambuf((streambuf *)local_ad8);
  output::~output((output *)0x1082d8);
  std::__cxx11::string::~string(local_a30);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing output device, reset");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_c30);
  output::output(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8,
                 (size_t)in_stack_ffffffffffffdbd0);
  booster::streambuf::streambuf((streambuf *)local_cd8);
  booster::streambuf::device(local_cd8);
  std::ostream::ostream(local_de8,(streambuf *)local_cd8);
  std::operator<<(local_de8,"test");
  booster::streambuf::reset_device();
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," test==\"test\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe3);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::ostream::~ostream(local_de8);
  booster::streambuf::~streambuf((streambuf *)local_cd8);
  output::~output((output *)0x10855c);
  std::__cxx11::string::~string(local_c30);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing seek fault");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e08,"foo",&local_e09);
  std::allocator<char>::~allocator((allocator<char> *)&local_e09);
  output::output(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8,
                 (size_t)in_stack_ffffffffffffdbd0);
  input::input((input *)in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
  booster::streambuf::streambuf((streambuf *)local_ed0);
  booster::streambuf::device(local_ed0);
  booster::streambuf::streambuf((streambuf *)local_f60);
  booster::streambuf::device(local_f60);
  std::istream::istream(local_1078,(streambuf *)local_f60);
  std::ostream::ostream(local_1188,(streambuf *)local_ed0);
  tests = tests + 1;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_1078 + *(long *)(local_1078[0] + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf0);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_1188 + *(long *)(local_1188[0] + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," out");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf1);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)in_stack_ffffffffffffdbd0,(streamoff)in_stack_ffffffffffffdbc8);
  std::istream::seekg(local_1078,local_1198,local_1190);
  tests = tests + 1;
  bVar2 = std::ios::operator!((ios *)((long)local_1078 + *(long *)(local_1078[0] + -0x18)));
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr," !in");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf3);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)in_stack_ffffffffffffdbd0,(streamoff)in_stack_ffffffffffffdbc8);
  std::ostream::seekp(local_1188,local_11a8,local_11a0);
  tests = tests + 1;
  bVar2 = std::ios::operator!((ios *)((long)local_1188 + *(long *)(local_1188[0] + -0x18)));
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr," !out");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xf5);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::ostream::~ostream(local_1188);
  std::istream::~istream(local_1078);
  booster::streambuf::~streambuf((streambuf *)local_f60);
  booster::streambuf::~streambuf((streambuf *)local_ed0);
  input::~input((input *)0x108bc1);
  output::~output((output *)0x108bce);
  std::__cxx11::string::~string(local_e08);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing tell fault");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11c8,"foo",&local_11c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c9);
  output::output(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8,
                 (size_t)in_stack_ffffffffffffdbd0);
  input::input((input *)in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
  booster::streambuf::streambuf((streambuf *)local_1290);
  booster::streambuf::device(local_1290);
  booster::streambuf::streambuf((streambuf *)local_1320);
  booster::streambuf::device(local_1320);
  std::istream::istream(local_1438,(streambuf *)local_1320);
  std::ostream::ostream(local_1548,(streambuf *)local_1290);
  tests = tests + 1;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_1438 + *(long *)(local_1438[0] + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," in");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x102);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_1548 + *(long *)(local_1548[0] + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," out");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x103);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  local_1558 = (fpos  [16])std::istream::tellg();
  sVar10 = std::fpos::operator_cast_to_long(local_1558);
  if ((int)sVar10 != -1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(in.tellg())==-1");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x104);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  local_1568 = (fpos  [16])std::ostream::tellp();
  sVar10 = std::fpos::operator_cast_to_long(local_1568);
  if ((int)sVar10 != -1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(out.tellp())==-1");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x105);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::ostream::~ostream(local_1548);
  std::istream::~istream(local_1438);
  booster::streambuf::~streambuf((streambuf *)local_1320);
  booster::streambuf::~streambuf((streambuf *)local_1290);
  input::~input((input *)0x10925e);
  output::~output((output *)0x10926b);
  std::__cxx11::string::~string(local_11c8);
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing random access device");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  seekable::seekable(in_stack_ffffffffffffdbd0);
  booster::streambuf::streambuf((streambuf *)local_1620);
  booster::streambuf::device(local_1620);
  std::iostream::iostream(local_1740,(streambuf *)local_1620);
  tests = tests + 1;
  local_1750 = (fpos  [16])std::istream::tellg();
  sVar10 = std::fpos::operator_cast_to_long(local_1750);
  if ((int)sVar10 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(io.tellg())==0");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x10e);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  local_1760 = (fpos  [16])std::ostream::tellp();
  sVar10 = std::fpos::operator_cast_to_long(local_1760);
  if ((int)sVar10 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(io.tellp())==0");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x10f);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::operator<<(local_1730,"test");
  tests = tests + 1;
  local_1770 = (fpos  [16])std::istream::tellg();
  sVar10 = std::fpos::operator_cast_to_long(local_1770);
  if ((int)sVar10 != 4) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(io.tellg())==4");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x111);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  local_1780 = (fpos  [16])std::ostream::tellp();
  sVar10 = std::fpos::operator_cast_to_long(local_1780);
  if ((int)sVar10 != 4) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(io.tellp())==4");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x112);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_1740 + *(long *)(local_1740[0] + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," io");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x113);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)in_stack_ffffffffffffdbd0,(streamoff)in_stack_ffffffffffffdbc8);
  plVar6 = (long *)std::ostream::seekp(local_1730,local_1790,local_1788);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," io.seekp(1)");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x114);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::operator<<(local_1730,"x");
  tests = tests + 1;
  local_17a0 = (fpos  [16])std::ostream::tellp();
  sVar10 = std::fpos::operator_cast_to_long(local_17a0);
  if ((int)sVar10 != 2) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(io.tellp())==2");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x116);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)in_stack_ffffffffffffdbd0,(streamoff)in_stack_ffffffffffffdbc8);
  plVar6 = (long *)std::istream::seekg(local_1740,local_17b0,local_17a8);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," io.seekg(0)");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x117);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_1740 + *(long *)(local_1740[0] + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," io");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x118);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::__cxx11::string::string(local_17d0);
  std::operator>>((istream *)local_1740,local_17d0);
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," tmp==\"txst\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11b);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_1740 + *(long *)(local_1740[0] + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," io");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11c);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::ios::clear((long)local_1740 + *(long *)(local_1740[0] + -0x18),0);
  tests = tests + 1;
  local_17e0 = (fpos  [16])std::istream::tellg();
  sVar10 = std::fpos::operator_cast_to_long(local_17e0);
  if ((int)sVar10 != 4) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(io.tellg())==4");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11e);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  local_17f0 = (fpos  [16])std::ostream::tellp();
  sVar10 = std::fpos::operator_cast_to_long(local_17f0);
  if ((int)sVar10 != 4) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(io.tellp())==4");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11f);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::ios::clear((long)local_1740 + *(long *)(local_1740[0] + -0x18),0);
  std::operator<<(local_1730,"xxxx");
  tests = tests + 1;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_1740 + *(long *)(local_1740[0] + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," io");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x122);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  local_1800 = (fpos  [16])std::ostream::tellp();
  sVar10 = std::fpos::operator_cast_to_long(local_1800);
  if ((int)sVar10 != 8) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(io.tellp())==8");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x123);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  local_1810 = (fpos  [16])std::istream::tellg();
  sVar10 = std::fpos::operator_cast_to_long(local_1810);
  if ((int)sVar10 != 8) {
    poVar5 = std::operator<<((ostream *)&std::cerr," int(io.tellg())==8");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x124);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  tests = tests + 1;
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)in_stack_ffffffffffffdbd0,(streamoff)in_stack_ffffffffffffdbc8);
  plVar6 = (long *)std::istream::seekg(local_1740,local_1820,local_1818);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," io.seekg(0)");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x125);
    poVar5 = std::operator<<(poVar5," failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::operator>>((istream *)local_1740,local_17d0);
  tests = tests + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr," tmp==\"txstxxxx\"");
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x127);
    in_stack_ffffffffffffdbd0 = (seekable *)std::operator<<(poVar5," failed");
    std::ostream::operator<<(in_stack_ffffffffffffdbd0,std::endl<char,std::char_traits<char>>);
    errors = errors + 1;
  }
  std::__cxx11::string::~string(local_17d0);
  std::iostream::~iostream(local_1740);
  booster::streambuf::~streambuf((streambuf *)local_1620);
  seekable::~seekable(in_stack_ffffffffffffdbd0);
  bVar1 = errors != 0;
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Fail: passed ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,tests - errors);
    poVar5 = std::operator<<(poVar5," tests ");
    poVar5 = std::operator<<(poVar5," failed ");
    this = (void *)std::ostream::operator<<(poVar5,errors);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"ok, passed ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,tests);
    poVar5 = std::operator<<(poVar5," tests ");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

int main()
{
	try {
		{
			std::cout << "Testing input device" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			in >> s ;
			TEST(s=="Hello");
			in >> s;
			TEST(s=="World");
			in >> s;
			TEST(s=="done");
			TEST(in.eof());
		}
		{
			std::cout << "Testing input device, small buffer" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			in >> s ;
			TEST(s=="Hello");
			in >> s;
			TEST(s=="World");
			in >> s;
			TEST(s=="done");
			TEST(in.eof());
		}
		{
			std::cout << "Testing input device, putback" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			TEST(in.get() == 'H');
			TEST(in.get() == 'e');
			TEST(in.get() == 'l');
			TEST(in.get() == 'l');
			TEST(in.putback('l'));
			TEST(in.putback('l'));
			TEST(in.putback('e'));
			TEST(in.get() == 'e');
			TEST(in.get() == 'l');
			TEST(in.get() == 'l');
			TEST(in.get() == 'o');
			TEST(in.putback('o'));
			TEST(in.get() == 'o');
			TEST(in.get() == ' ');
			TEST(in.unget());
			TEST(in.get() == ' ');
			TEST(!in.putback('x'));
		}
		{
			std::cout << "Testing input device, putback fail" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			TEST(in.get() == 'H');
			TEST(in.get() == 'e');
			TEST(in.get() == 'l');
			TEST(in.get() == 'l');
			TEST(!in.unget() || !in.unget() || !in.unget());
		}
		{
			std::cout << "Testing output device" << std::endl;
			std::string test;
			output id(&test,5);
			booster::streambuf buf;
			buf.device(id);
			std::ostream out(&buf);
			out << "test";
			TEST(test=="");
			out << std::flush;
			TEST(test=="test");
			TEST(out);
			out << "ab" << std::flush;
			TEST(!out);
			TEST(test=="testa");
		}
		{
			std::cout << "Testing output device, small buffer size" << std::endl;
			std::string test;
			output id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::ostream out(&buf);
			std::string test_msg = "To be or not to be, that is the question!";
			out << test_msg;
			TEST(test_msg.size() - 3 <= test.size());
			TEST(test.size() <= test_msg.size());
			out << std::flush;
			TEST(test==test_msg);
		}
		{
			std::cout << "Testing output device, reset" << std::endl;
			std::string test;
			output id(&test);
			booster::streambuf buf;
			buf.device(id);
			std::ostream out(&buf);
			out << "test";
			buf.reset_device();
			TEST(test=="test");
		}
		{
			std::cout << "Testing seek fault" << std::endl;
			std::string dummy="foo";
			output od(&dummy);
			input id(&dummy);
			booster::streambuf os;
			os.device(od);
			booster::streambuf is;
			is.device(id);
			std::istream in(&is);
			std::ostream out(&os);
			TEST(in);
			TEST(out);
			in.seekg(0);
			TEST(!in);
			out.seekp(0);
			TEST(!out);
		}
		{
			std::cout << "Testing tell fault" << std::endl;
			std::string dummy="foo";
			output od(&dummy);
			input id(&dummy);
			booster::streambuf os;
			os.device(od);
			booster::streambuf is;
			is.device(id);
			std::istream in(&is);
			std::ostream out(&os);
			TEST(in);
			TEST(out);
			TEST(int(in.tellg())==-1);
			TEST(int(out.tellp())==-1);
		}
		{
			std::cout << "Testing random access device" << std::endl;
			seekable sd;
			booster::streambuf buf;
			buf.device(sd);
			std::iostream io(&buf);
			
			TEST(int(io.tellg())==0);
			TEST(int(io.tellp())==0);
			io << "test";
			TEST(int(io.tellg())==4);
			TEST(int(io.tellp())==4);
			TEST(io);
			TEST(io.seekp(1));
			io << "x";
			TEST(int(io.tellp())==2);
			TEST(io.seekg(0));
			TEST(io);
			std::string tmp;
			io >> tmp;
			TEST(tmp=="txst");
			TEST(io);
			io.clear();
			TEST(int(io.tellg())==4);
			TEST(int(io.tellp())==4);
			io.clear();
			io << "xxxx";
			TEST(io);
			TEST(int(io.tellp())==8);
			TEST(int(io.tellg())==8);
			TEST(io.seekg(0));
			io >> tmp;
			TEST(tmp=="txstxxxx");
		}
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return 1;
	}
	if(errors == 0) {
		std::cout << "ok, passed " << tests << " tests "<< std::endl;
		return 0;
	}
	else { 
		std::cerr << "Fail: passed " << tests - errors<< " tests " << " failed " << errors << std::endl;
		return 1;
	}

}